

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.c
# Opt level: O1

_Bool effect_do(effect *effect,source origin,object *obj,_Bool *ident,_Bool aware,wchar_t dir,
               wchar_t beam,wchar_t boost,command *cmd)

{
  uint16_t uVar1;
  ushort uVar2;
  bool bVar3;
  _Bool _Var4;
  _Bool _Var5;
  wchar_t count;
  wchar_t wVar6;
  wchar_t wVar7;
  int iVar8;
  int iVar9;
  random_value local_c8;
  anon_union_8_4_b62eeb40_for_which_conflict local_b0;
  object *local_a8;
  effect_handler_context_t local_a0;
  
  local_b0 = origin.which;
  local_c8.base = 0;
  local_c8.dice = 0;
  local_c8.sides = 0;
  local_c8.m_bonus = 0;
  _Var4 = false;
  local_a8 = obj;
  do {
    if ((effect == (effect *)0x0) || (0x6f < (ushort)((short)*(undefined4 *)&effect->index - 1U))) {
      msg("Bad effect passed to effect_do(). Please report this bug.");
      iVar9 = 1;
    }
    else {
      if (effect->dice == (dice_t *)0x0) {
        count = L'\0';
      }
      else {
        count = dice_roll(effect->dice,&local_c8);
      }
      uVar1 = effect->index;
      if ((uVar1 == 0x6c) || (iVar8 = 1, uVar1 == 1)) {
        if (count < L'\x01') {
          effect = effect->next;
          iVar9 = 3;
          iVar8 = 1;
LAB_0014212b:
          _Var4 = true;
          bVar3 = false;
        }
        else if ((count == L'\x01' || origin.what != SRC_PLAYER) || uVar1 == 1) {
          local_a0.effect = Rand_div(count);
          wVar6 = local_a0.effect;
LAB_001420e4:
          do {
            effect = effect->next;
            wVar7 = wVar6 + L'\xffffffff';
            if (wVar6 == L'\0') break;
            wVar6 = wVar7;
          } while (effect != (effect *)0x0);
          iVar8 = count - local_a0.effect;
          iVar9 = 0;
          local_a0.effect = wVar7;
          if (effect == (effect *)0x0) {
            iVar9 = 2;
            effect = (effect *)0x0;
            goto LAB_0014212b;
          }
          bVar3 = true;
          if (effect->dice != (dice_t *)0x0) {
            dice_roll(effect->dice,&local_c8);
          }
        }
        else {
          if (uVar1 != 0x6c) {
            __assert_fail("effect->index == EF_SELECT && origin.what == SRC_PLAYER",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/effects.c"
                          ,0x1af,
                          "_Bool effect_do(struct effect *, struct source, struct object *, _Bool *, _Bool, int, int, int, struct command *)"
                         );
          }
          *ident = true;
          if (cmd == (command *)0x0) {
            local_a0.effect = get_effect_from_list((char *)0x0,effect->next,count,true);
            if (local_a0.effect != L'\xffffffff') goto LAB_001420b8;
          }
          else {
            wVar6 = cmd_get_effect_from_list
                              ((command_conflict *)cmd,"list_index",(int *)&local_a0,(char *)0x0,
                               effect->next,count,true);
            if (wVar6 == L'\0') {
LAB_001420b8:
              if (local_a0.effect == L'\xfffffffe') {
                local_a0.effect = Rand_div(count);
              }
              if (((int)local_a0.effect < L'\0') ||
                 (wVar6 = local_a0.effect, count <= (int)local_a0.effect)) {
                __assert_fail("choice >= 0 && choice < choice_count",
                              "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/effects.c"
                              ,0x1cc,
                              "_Bool effect_do(struct effect *, struct source, struct object *, _Bool *, _Bool, int, int, int, struct command *)"
                             );
              }
              goto LAB_001420e4;
            }
          }
          bVar3 = false;
          iVar8 = 1;
          iVar9 = 1;
        }
        if (!bVar3) goto LAB_00141fc6;
      }
      uVar2 = effect->index;
      if ((uVar2 != 0) && (uVar2 != 0x71)) {
        local_a0.effect = (effect_index)effect->index;
        local_a0.origin.which = local_b0;
        local_a0.obj = local_a8;
        local_a0.dir = dir;
        local_a0.beam = beam;
        local_a0.boost = boost;
        local_a0.value.base = local_c8.base;
        local_a0.value.dice = local_c8.dice;
        local_a0.value.sides = local_c8.sides;
        local_a0.value.m_bonus = local_c8.m_bonus;
        local_a0.subtype = effect->subtype;
        local_a0.radius = effect->radius;
        local_a0.other = effect->other;
        local_a0.y = effect->y;
        local_a0.x = effect->x;
        local_a0.msg = effect->msg;
        local_a0.ident = *ident;
        local_a0.origin.what = origin.what;
        local_a0.aware = aware;
        local_a0.cmd = cmd;
        _Var5 = (*effects[uVar2].handler)(&local_a0);
        if (_Var5) {
          _Var4 = true;
        }
        *ident = local_a0.ident;
      }
      for (; (iVar9 = 0, iVar8 != 0 && (iVar9 = 0, effect != (effect *)0x0)); effect = effect->next)
      {
        iVar8 = iVar8 + -1;
      }
    }
LAB_00141fc6:
    if ((iVar9 != 0) && (iVar9 != 3)) {
      if (iVar9 == 2) {
        return _Var4;
      }
      return false;
    }
    if (effect == (effect *)0x0) {
      return _Var4;
    }
  } while( true );
}

Assistant:

bool effect_do(struct effect *effect,
		struct source origin,
		struct object *obj,
		bool *ident,
		bool aware,
		int dir,
		int beam,
		int boost,
		struct command *cmd)
{
	bool completed = false;
	effect_handler_f handler;
	random_value value = { 0, 0, 0, 0 };

	do {
		int choice_count = 0, leftover = 1;

		if (!effect_valid(effect)) {
			msg("Bad effect passed to effect_do(). Please report this bug.");
			return false;
		}

		if (effect->dice != NULL)
			choice_count = dice_roll(effect->dice, &value);

		/* Deal with special random and select effects */
		if (effect->index == EF_RANDOM || effect->index == EF_SELECT) {
			int choice;

			/*
			 * If it has no subeffects, act as if it completed
			 * successfully and go to the next effect.
			 */
			if (choice_count <= 0) {
				completed = true;
				effect = effect->next;
				continue;
			}

			/*
			 * Treat select effects like random ones if they
			 * aren't from a player or if there's really no choice
			 * to be made.
			 */
			if (effect->index == EF_RANDOM ||
					origin.what != SRC_PLAYER ||
					choice_count < 2) {
				choice = randint0(choice_count);
			} else {
				assert(effect->index == EF_SELECT &&
					origin.what == SRC_PLAYER);
				/*
				 * Since a choice is presented, allow
				 * identification, even if no choice is made.
				 */
				*ident = true;
				if (cmd) {
					if (cmd_get_effect_from_list(cmd,
							"list_index",
							&choice, NULL,
							effect->next,
							choice_count,
							true) != CMD_OK) {
						return false;
					}
				} else {
					choice = get_effect_from_list(NULL,
						effect->next, choice_count,
						true);
					if (choice == -1) return false;
				}

				/*
				 * If the player chose to use a random effect,
				 * roll for it.
				 */
				if (choice == -2) {
					choice = randint0(choice_count);
				}
				assert(choice >= 0 && choice < choice_count);
			}

			leftover = choice_count - choice;

			/* Skip to the chosen effect */
			effect = effect->next;
			while (choice-- && effect)
				effect = effect->next;
			if (!effect) {
				/*
				 * There's fewer subeffects than expected.  Act
				 * as if it ran successfully.
				 */
				completed = true;
				break;
			}

			/* Roll the damage, if needed */
			if (effect->dice != NULL)
				(void) dice_roll(effect->dice, &value);
		}

		/* Handle the effect */
		handler = effects[effect->index].handler;
		if (handler != NULL) {
			effect_handler_context_t context = {
				effect->index,
				origin,
				obj,
				aware,
				dir,
				beam,
				boost,
				value,
				effect->subtype,
				effect->radius,
				effect->other,
				effect->y,
				effect->x,
				effect->msg,
				*ident,
				cmd
			};

			completed = handler(&context) || completed;
			*ident = context.ident;
		}

		/* Get the next effect, if there is one */
		while (leftover-- && effect)
			effect = effect->next;
	} while (effect);

	return completed;
}